

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O3

void dlib::blas_bindings::
     matrix_assign_blas<float,dlib::matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_add_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
               *src)

{
  matrix_op<dlib::op_pointer_to_mat<float>_> *pmVar1;
  matrix_op<dlib::op_pointer_to_mat<float>_> *lhs;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> *rhs;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout> temp;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_30;
  
  pmVar1 = src->lhs;
  pfVar3 = dest->ptr;
  pfVar4 = (pmVar1->op).ptr;
  if (pfVar3 != pfVar4) {
    lhs = src->rhs->lhs;
    if ((pfVar3 != (lhs->op).ptr) &&
       ((rhs = src->rhs->rhs, (rhs->data).nc_ == 0 || (rhs->data).nr_ == 0 ||
        (pfVar3 != (rhs->data).data)))) {
      lVar2 = (pmVar1->op).rows;
      if (0 < lVar2) {
        lVar6 = dest->width;
        lVar7 = (pmVar1->op).cols;
        lVar5 = (pmVar1->op).stride;
        lVar8 = 0;
        do {
          if (0 < lVar7) {
            lVar9 = 0;
            do {
              pfVar3[lVar9] = pfVar4[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar7 != lVar9);
          }
          lVar8 = lVar8 + 1;
          pfVar3 = pfVar3 + lVar6;
          pfVar4 = pfVar4 + lVar5;
        } while (lVar8 != lVar2);
      }
      default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
                (dest,lhs,rhs);
      return;
    }
  }
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
  matrix(&local_30,dest->height,dest->width);
  pmVar1 = src->lhs;
  lVar2 = (pmVar1->op).rows;
  if (0 < lVar2) {
    pfVar3 = (pmVar1->op).ptr;
    lVar6 = (pmVar1->op).cols;
    lVar7 = (pmVar1->op).stride;
    lVar5 = 0;
    pfVar4 = local_30.data.data;
    do {
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          pfVar4[lVar8] = pfVar3[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      lVar5 = lVar5 + 1;
      pfVar4 = pfVar4 + local_30.data.nc_;
      pfVar3 = pfVar3 + lVar7;
    } while (lVar5 != lVar2);
  }
  default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
            (&local_30,src->rhs->lhs,src->rhs->rhs);
  if (0 < local_30.data.nr_) {
    lVar2 = dest->width;
    pfVar3 = dest->ptr;
    lVar6 = 0;
    pfVar4 = local_30.data.data;
    do {
      if (0 < local_30.data.nc_) {
        lVar7 = 0;
        do {
          pfVar3[lVar7] = pfVar4[lVar7];
          lVar7 = lVar7 + 1;
        } while (local_30.data.nc_ != lVar7);
      }
      lVar6 = lVar6 + 1;
      pfVar3 = pfVar3 + lVar2;
      pfVar4 = pfVar4 + local_30.data.nc_;
    } while (lVar6 != local_30.data.nr_);
  }
  if (local_30.data.data != (float *)0x0) {
    operator_delete__(local_30.data.data);
  }
  return;
}

Assistant:

void matrix_assign_blas (
            assignable_ptr_matrix<T>& dest,
            const src_exp& src
        )
        {
            if (src.aliases(mat(dest.ptr,dest.height,dest.width)))
            {
                matrix<T> temp(dest.nr(),dest.nc());
                matrix_assign_blas_proxy(temp,src,1,false, false);
                matrix_assign_default(dest,temp);
            }
            else
            {
                matrix_assign_blas_proxy(dest,src,1,false, false);
            }
        }